

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fShaderCommonFunctionTests.cpp
# Opt level: O0

void __thiscall
deqp::gles31::Functional::AbsCase::getInputValues(AbsCase *this,int numValues,void **values)

{
  bool bVar1;
  deUint32 dVar2;
  DataType dataType;
  Precision PVar3;
  int iVar4;
  int minValue;
  int maxValue;
  char *str;
  const_reference pvVar5;
  vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
  *this_00;
  float minValue_00;
  float maxValue_00;
  int scalarSize;
  Precision precision;
  DataType type;
  Random rnd;
  IVec2 intRanges [3];
  Vector<float,_2> local_38;
  Vec2 floatRanges [3];
  void **values_local;
  int numValues_local;
  AbsCase *this_local;
  
  floatRanges[2].m_data = (float  [2])values;
  tcu::Vector<float,_2>::Vector(&local_38,-2.0,2.0);
  tcu::Vector<float,_2>::Vector(floatRanges,-1000.0,1000.0);
  tcu::Vector<float,_2>::Vector(floatRanges + 1,-1e+07,1e+07);
  tcu::Vector<int,_2>::Vector((Vector<int,_2> *)&rnd.m_rnd.z,-0x7f,0x7f);
  tcu::Vector<int,_2>::Vector(intRanges,-0x7fff,0x7fff);
  tcu::Vector<int,_2>::Vector(intRanges + 1,-0x7fffffff,0x7fffffff);
  str = tcu::TestNode::getName((TestNode *)this);
  dVar2 = deStringHash(str);
  de::Random::Random((Random *)&precision,dVar2 ^ 0x235fac);
  this_00 = &(this->super_CommonFunctionCase).m_spec.inputs;
  pvVar5 = std::
           vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
           ::operator[](this_00,0);
  dataType = glu::VarType::getBasicType(&pvVar5->varType);
  pvVar5 = std::
           vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
           ::operator[](this_00,0);
  PVar3 = glu::VarType::getPrecision(&pvVar5->varType);
  iVar4 = glu::getDataTypeScalarSize(dataType);
  bVar1 = glu::isDataTypeFloatOrVec(dataType);
  if (bVar1) {
    minValue_00 = tcu::Vector<float,_2>::x(floatRanges + ((ulong)PVar3 - 1));
    maxValue_00 = tcu::Vector<float,_2>::y(floatRanges + ((ulong)PVar3 - 1));
    fillRandomScalars<float>
              ((Random *)&precision,minValue_00,maxValue_00,*(void **)floatRanges[2].m_data,
               numValues * iVar4,0);
  }
  else {
    minValue = tcu::Vector<int,_2>::x(intRanges + ((ulong)PVar3 - 1));
    maxValue = tcu::Vector<int,_2>::y(intRanges + ((ulong)PVar3 - 1));
    fillRandomScalars<int>
              ((Random *)&precision,minValue,maxValue,*(void **)floatRanges[2].m_data,
               numValues * iVar4,0);
  }
  de::Random::~Random((Random *)&precision);
  return;
}

Assistant:

void getInputValues (int numValues, void* const* values) const
	{
		const Vec2 floatRanges[] =
		{
			Vec2(-2.0f,		2.0f),	// lowp
			Vec2(-1e3f,		1e3f),	// mediump
			Vec2(-1e7f,		1e7f)	// highp
		};
		const IVec2 intRanges[] =
		{
			IVec2(-(1<<7)+1,	(1<<7)-1),
			IVec2(-(1<<15)+1,	(1<<15)-1),
			IVec2(0x80000001,	0x7fffffff)
		};

		de::Random				rnd			(deStringHash(getName()) ^ 0x235facu);
		const glu::DataType		type		= m_spec.inputs[0].varType.getBasicType();
		const glu::Precision	precision	= m_spec.inputs[0].varType.getPrecision();
		const int				scalarSize	= glu::getDataTypeScalarSize(type);

		if (glu::isDataTypeFloatOrVec(type))
			fillRandomScalars(rnd, floatRanges[precision].x(), floatRanges[precision].y(), values[0], numValues*scalarSize);
		else
			fillRandomScalars(rnd, intRanges[precision].x(), intRanges[precision].y(), values[0], numValues*scalarSize);
	}